

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPI.cxx
# Opt level: O1

vector<unsigned_long,_std::allocator<unsigned_long>_> * __thiscall
cmFileAPI::GetConfigureLogVersions
          (vector<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,
          cmFileAPI *this)

{
  pointer pOVar1;
  iterator iVar2;
  _Base_ptr p_Var3;
  pointer puVar4;
  long lVar5;
  _Rb_tree_node_base *p_Var6;
  ulong uVar7;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var8;
  pointer puVar9;
  _Base_ptr *__args;
  _Base_ptr p_Var10;
  unsigned_long *puVar11;
  pointer pOVar12;
  
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pOVar12 = (this->TopQuery).Known.
            super__Vector_base<cmFileAPI::Object,_std::allocator<cmFileAPI::Object>_>._M_impl.
            super__Vector_impl_data._M_start;
  pOVar1 = (this->TopQuery).Known.
           super__Vector_base<cmFileAPI::Object,_std::allocator<cmFileAPI::Object>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pOVar12 != pOVar1) {
    puVar11 = &pOVar12->Version;
    do {
      if (((Object *)(puVar11 + -1))->Kind == ConfigureLog) {
        iVar2._M_current =
             (__return_storage_ptr__->
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>
                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)__return_storage_ptr__,
                     iVar2,puVar11);
        }
        else {
          *iVar2._M_current = *puVar11;
          (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
          )._M_impl.super__Vector_impl_data._M_finish = iVar2._M_current + 1;
        }
      }
      pOVar12 = (pointer)(puVar11 + 1);
      puVar11 = puVar11 + 2;
    } while (pOVar12 != pOVar1);
  }
  for (p_Var6 = (this->ClientQueries)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var6 != &(this->ClientQueries)._M_t._M_impl.super__Rb_tree_header;
      p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
    p_Var3 = p_Var6[2]._M_parent;
    if (*(_Base_ptr *)(p_Var6 + 2) != p_Var3) {
      __args = &(*(_Base_ptr *)(p_Var6 + 2))->_M_parent;
      do {
        if (((_Rb_tree_node_base *)(__args + -1))->_M_color == _S_black) {
          iVar2._M_current =
               (__return_storage_ptr__->
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar2._M_current ==
              (__return_storage_ptr__->
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_realloc_insert<unsigned_long_const&>
                      ((vector<unsigned_long,std::allocator<unsigned_long>> *)__return_storage_ptr__
                       ,iVar2,(unsigned_long *)__args);
          }
          else {
            *iVar2._M_current = (unsigned_long)*__args;
            (__return_storage_ptr__->
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_finish = iVar2._M_current + 1;
          }
        }
        p_Var10 = (_Base_ptr)(__args + 1);
        __args = __args + 2;
      } while (p_Var10 != p_Var3);
    }
  }
  puVar4 = (__return_storage_ptr__->
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar9 = (__return_storage_ptr__->
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar4 != puVar9) {
    uVar7 = (long)puVar9 - (long)puVar4 >> 3;
    lVar5 = 0x3f;
    if (uVar7 != 0) {
      for (; uVar7 >> lVar5 == 0; lVar5 = lVar5 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (puVar4,puVar9,((uint)lVar5 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (puVar4,puVar9);
  }
  _Var8 = std::
          __unique<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                    ((__return_storage_ptr__->
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                     super__Vector_impl_data._M_start,
                     (__return_storage_ptr__->
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                     super__Vector_impl_data._M_finish);
  puVar11 = (__return_storage_ptr__->
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  if ((_Var8._M_current != puVar11) &&
     (puVar4 = (__return_storage_ptr__->
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_finish,
     puVar9 = (pointer)((long)_Var8._M_current + ((long)puVar4 - (long)puVar11)), puVar4 != puVar9))
  {
    (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
    _M_impl.super__Vector_impl_data._M_finish = puVar9;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<unsigned long> cmFileAPI::GetConfigureLogVersions()
{
  std::vector<unsigned long> versions;
  auto getConfigureLogVersions = [&versions](Query const& q) {
    for (Object const& o : q.Known) {
      if (o.Kind == ObjectKind::ConfigureLog) {
        versions.emplace_back(o.Version);
      }
    }
  };
  getConfigureLogVersions(this->TopQuery);
  for (auto const& client : this->ClientQueries) {
    getConfigureLogVersions(client.second.DirQuery);
  }
  std::sort(versions.begin(), versions.end());
  versions.erase(std::unique(versions.begin(), versions.end()),
                 versions.end());
  return versions;
}